

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

void __thiscall smf::MidiMessage::makePatchChange(MidiMessage *this,int channel,int patchnum)

{
  byte local_1a;
  byte local_19;
  int local_18;
  int local_14;
  int patchnum_local;
  int channel_local;
  MidiMessage *this_local;
  
  local_18 = patchnum;
  local_14 = channel;
  _patchnum_local = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0);
  local_19 = (byte)local_14 & 0xf | 0xc0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_19);
  local_1a = (byte)local_18 & 0x7f;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_1a);
  return;
}

Assistant:

void MidiMessage::makePatchChange(int channel, int patchnum) {
	resize(0);
	push_back(0xc0 | (0x0f & channel));
	push_back(0x7f & patchnum);
}